

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long *__dest;
  int iVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  char *pcVar10;
  long lVar11;
  ImVector<const_char_*> candidates;
  int local_68;
  int iStack_64;
  long *plStack_60;
  
  if (data->EventFlag != 0x80) {
    if (data->EventFlag != 0x40) {
      return 0;
    }
    pcVar10 = data->Buf + data->CursorPos;
    pcVar6 = pcVar10;
    do {
      if (pcVar6 <= data->Buf) break;
      if (((ulong)(byte)pcVar6[-1] < 0x3c) &&
         ((0x800100100000200U >> ((ulong)(byte)pcVar6[-1] & 0x3f) & 1) != 0)) {
        bVar9 = false;
      }
      else {
        pcVar6 = pcVar6 + -1;
        bVar9 = true;
      }
    } while (bVar9);
    local_68 = 0;
    iStack_64 = 0;
    plStack_60 = (long *)0x0;
    iVar7 = (int)pcVar6;
    iVar5 = (int)pcVar10;
    if (0 < (this->Commands).Size) {
      lVar11 = 0;
      do {
        iVar2 = Strnicmp((this->Commands).Data[lVar11],pcVar6,iVar5 - iVar7);
        if (iVar2 == 0) {
          if ((this->Commands).Size <= lVar11) goto LAB_00163799;
          ppcVar1 = (this->Commands).Data;
          __dest = plStack_60;
          if (local_68 == iStack_64) {
            if (iStack_64 == 0) {
              iVar2 = 8;
            }
            else {
              iVar2 = iStack_64 / 2 + iStack_64;
            }
            iVar3 = local_68 + 1;
            if (local_68 + 1 < iVar2) {
              iVar3 = iVar2;
            }
            if ((iStack_64 < iVar3) &&
               (__dest = (long *)ImGui::MemAlloc((long)iVar3 << 3), iStack_64 = iVar3,
               plStack_60 != (long *)0x0)) {
              memcpy(__dest,plStack_60,(long)local_68 << 3);
              ImGui::MemFree(plStack_60);
            }
          }
          plStack_60 = __dest;
          plStack_60[local_68] = (long)ppcVar1[lVar11];
          local_68 = local_68 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (this->Commands).Size);
    }
    if ((long)local_68 == 0) {
      AddLog(this,"No match for \"%.*s\"!\n",(ulong)(uint)(iVar5 - iVar7),pcVar6);
    }
    else {
      if (local_68 == 1) {
        ImGuiInputTextCallbackData::DeleteChars(data,iVar7 - *(int *)&data->Buf,iVar5 - iVar7);
        ImGuiInputTextCallbackData::InsertChars
                  (data,data->CursorPos,(char *)*plStack_60,(char *)0x0);
        ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos," ",(char *)0x0);
        goto LAB_0016371a;
      }
      uVar8 = iVar5 - iVar7;
      do {
        if (local_68 < 1) {
          bVar9 = true;
          uVar4 = 1;
        }
        else {
          iVar2 = 0;
          bVar9 = true;
          lVar11 = 1;
          do {
            if (lVar11 == 1) {
              iVar2 = toupper((int)*(char *)(*plStack_60 + (long)(int)uVar8));
            }
            else if ((iVar2 == 0) ||
                    (iVar3 = toupper((int)*(char *)(plStack_60[lVar11 + -1] + (long)(int)uVar8)),
                    iVar2 != iVar3)) {
              bVar9 = false;
            }
          } while ((lVar11 < local_68) && (lVar11 = lVar11 + 1, bVar9));
          uVar4 = (uint)bVar9;
        }
        uVar8 = uVar8 + uVar4;
      } while (bVar9 != false);
      if (0 < (int)uVar8) {
        ImGuiInputTextCallbackData::DeleteChars(data,iVar7 - *(int *)&data->Buf,iVar5 - iVar7);
        if (local_68 < 1) {
LAB_00163799:
          pcVar6 = "T &ImVector<const char *>::operator[](int) [T = const char *]";
          goto LAB_001637ae;
        }
        ImGuiInputTextCallbackData::InsertChars
                  (data,data->CursorPos,(char *)*plStack_60,(char *)*plStack_60 + uVar8);
      }
      AddLog(this,"Possible matches:\n");
      if (0 < local_68) {
        lVar11 = 0;
        do {
          AddLog(this,"- %s\n",plStack_60[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < local_68);
      }
    }
LAB_0016371a:
    if (plStack_60 == (long *)0x0) {
      return 0;
    }
    ImGui::MemFree(plStack_60);
    return 0;
  }
  uVar8 = this->HistoryPos;
  if (data->EventKey == 0x204) {
    if (uVar8 != 0xffffffff) {
      iVar7 = uVar8 + 1;
      this->HistoryPos = iVar7;
      iVar5 = -1;
      if (iVar7 < (this->History).Size) {
        iVar5 = iVar7;
      }
      goto LAB_00163735;
    }
  }
  else if (data->EventKey == 0x203) {
    if (uVar8 == 0xffffffff) {
      iVar5 = (this->History).Size + -1;
    }
    else {
      if ((int)uVar8 < 1) goto LAB_0016373d;
      iVar5 = uVar8 - 1;
    }
LAB_00163735:
    this->HistoryPos = iVar5;
  }
LAB_0016373d:
  uVar4 = this->HistoryPos;
  if (uVar8 != uVar4) {
    if ((int)uVar4 < 0) {
      pcVar6 = "";
    }
    else {
      if ((this->History).Size <= (int)uVar4) {
        pcVar6 = "T &ImVector<char *>::operator[](int) [T = char *]";
LAB_001637ae:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                      ,0x703,pcVar6);
      }
      pcVar6 = (this->History).Data[uVar4];
    }
    ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
    ImGuiInputTextCallbackData::InsertChars(data,0,pcVar6,(char *)0x0);
  }
  return 0;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end - word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end - word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing.
                    data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can..
                    // So inputing "C"+Tab will complete to "CL" then display "CLEAR" and "CLASSIFY" as matches.
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }